

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::add_bytes(CmdlineParser *this,string *longkey,uint32_t *dest,string *desc)

{
  allocator local_49;
  string local_48;
  string *local_28;
  string *desc_local;
  uint32_t *dest_local;
  string *longkey_local;
  CmdlineParser *this_local;
  
  local_28 = desc;
  desc_local = (string *)dest;
  dest_local = (uint32_t *)longkey;
  longkey_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  add_bytes(this,'\0',longkey,&local_48,(uint32_t *)desc_local,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void CmdlineParser::add_bytes(const std::string& longkey,
                              uint32_t& dest, const std::string& desc) {
    return add_bytes(0, longkey, "", dest, desc);
}